

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall camp::BadType::BadType(BadType *this,Type provided,Type expected)

{
  Type type;
  undefined4 in_register_00000034;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  typeName_abi_cxx11_(&local_38,(BadType *)CONCAT44(in_register_00000034,provided),expected);
  std::operator+(&local_98,"value of type ",&local_38);
  std::operator+(&local_78,&local_98," couldn\'t be converted to type ");
  typeName_abi_cxx11_(&sStack_b8,(BadType *)(ulong)expected,type);
  std::operator+(&local_58,&local_78,&sStack_b8);
  Error::Error(&this->super_Error,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Error = &PTR__Error_00141118;
  return;
}

Assistant:

BadType::BadType(Type provided, Type expected)
    : Error("value of type " + typeName(provided) + " couldn't be converted to type " + typeName(expected))
{
}